

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

iterator __thiscall re2::SparseArray<int>::set_new(SparseArray<int> *this,int i,int v)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  iterator iVar5;
  
  uVar1 = this->size_;
  if ((int)uVar1 < 0) {
    __assert_fail("(0) <= (size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c4,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
  }
  uVar2 = this->max_size_;
  if ((int)uVar2 < (int)uVar1) {
    __assert_fail("(size_) <= (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c5,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
  }
  piVar4 = this->sparse_to_dense_;
  if (piVar4 == (int *)0x0 && uVar1 != 0) {
    __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c6,"void re2::SparseArray<int>::DebugCheckInvariants() const [Value = int]");
  }
  if ((uint)i < uVar2) {
    if (((uint)piVar4[(uint)i] < uVar1) &&
       ((this->dense_).
        super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
        ._M_impl.super__Vector_impl_data._M_start[(uint)piVar4[(uint)i]].index_ == i)) {
      __assert_fail("!has_index(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x186,
                    "typename SparseArray<Value>::iterator re2::SparseArray<int>::set_new(int, Value) [Value = int]"
                   );
    }
    if (uVar1 < uVar2) {
      piVar4[(uint)i] = uVar1;
      iVar3 = this->size_;
      (this->dense_).
      super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar3].index_ = i;
      this->size_ = iVar3 + 1;
      iVar5 = set_existing(this,i,v);
      return (iterator)iVar5._M_current;
    }
    __assert_fail("(size_) < (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1a9,"void re2::SparseArray<int>::create_index(int) [Value = int]");
  }
  return (iterator)
         (this->dense_).
         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_new(int i, Value v) {
  DebugCheckInvariants();
  if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
    // Semantically, end() would be better here, but we already know
    // the user did something stupid, so begin() insulates them from
    // dereferencing an invalid pointer.
    return begin();
  }
  DCHECK(!has_index(i));
  create_index(i);
  return set_existing(i, v);
}